

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint waitForDsrEQ(uchar mask,uchar bitVal,ulong ms)

{
  byte bVar1;
  int iVar2;
  longlong timer;
  
  timer = tmrReadTimer();
  do {
    bVar1 = in((undefined2)ZvgIO.ecpDsr);
    if (((bVar1 ^ bitVal) + 0x80 & mask) == 0) {
      return (uint)(byte)(bVar1 + 0x80);
    }
    iVar2 = tmrTestMillis(timer,(int)ms);
  } while (iVar2 == 0);
  return 0xffffffff;
}

Assistant:

static uint waitForDsrEQ( uchar mask, uchar bitVal, ulong ms)
{
	uchar		testVal;
	uchar		readVal;
	long long int	timer;
	bool		foundF;

	testVal = (bitVal ^ DSR_InvMask) & mask;
	foundF = zFalse;
	//tmrReadTimer(&timer);					// read timer value
	timer = tmrReadTimer();
	// loop until match found, or timeout

	do
	{
		if (((readVal = inportb( ZvgIO.ecpDsr)) & mask) == testVal)
		{	foundF = zTrue;				// indicate match was found
			break;
		}
	} while (!tmrTestMillis( timer, ms));

	if (!foundF)				
		return (ZVG_TIMEOUT);			// match not found, return error

	return (readVal ^ DSR_InvMask);	// fix logic and return value
}